

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O2

void volkGenLoadInstance(void *context,_func_PFN_vkVoidFunction_void_ptr_char_ptr *load)

{
  vkCreateDevice =
       (PFN_vkCreateDevice)(*vkGetInstanceProcAddr)((VkInstance)context,"vkCreateDevice");
  vkDestroyInstance =
       (PFN_vkDestroyInstance)(*vkGetInstanceProcAddr)((VkInstance)context,"vkDestroyInstance");
  vkEnumerateDeviceExtensionProperties =
       (PFN_vkEnumerateDeviceExtensionProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkEnumerateDeviceExtensionProperties");
  vkEnumerateDeviceLayerProperties =
       (PFN_vkEnumerateDeviceLayerProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkEnumerateDeviceLayerProperties");
  vkEnumeratePhysicalDevices =
       (PFN_vkEnumeratePhysicalDevices)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkEnumeratePhysicalDevices");
  vkGetDeviceProcAddr =
       (PFN_vkGetDeviceProcAddr)(*vkGetInstanceProcAddr)((VkInstance)context,"vkGetDeviceProcAddr");
  vkGetPhysicalDeviceFeatures =
       (PFN_vkGetPhysicalDeviceFeatures)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceFeatures");
  vkGetPhysicalDeviceFormatProperties =
       (PFN_vkGetPhysicalDeviceFormatProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceFormatProperties");
  vkGetPhysicalDeviceImageFormatProperties =
       (PFN_vkGetPhysicalDeviceImageFormatProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceImageFormatProperties");
  vkGetPhysicalDeviceMemoryProperties =
       (PFN_vkGetPhysicalDeviceMemoryProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceMemoryProperties");
  vkGetPhysicalDeviceProperties =
       (PFN_vkGetPhysicalDeviceProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceProperties");
  vkGetPhysicalDeviceQueueFamilyProperties =
       (PFN_vkGetPhysicalDeviceQueueFamilyProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceQueueFamilyProperties");
  vkGetPhysicalDeviceSparseImageFormatProperties =
       (PFN_vkGetPhysicalDeviceSparseImageFormatProperties)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceSparseImageFormatProperties");
  vkEnumeratePhysicalDeviceGroups =
       (PFN_vkEnumeratePhysicalDeviceGroups)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkEnumeratePhysicalDeviceGroups");
  vkGetPhysicalDeviceExternalBufferProperties =
       (PFN_vkGetPhysicalDeviceExternalBufferProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceExternalBufferProperties");
  vkGetPhysicalDeviceExternalFenceProperties =
       (PFN_vkGetPhysicalDeviceExternalFenceProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceExternalFenceProperties");
  vkGetPhysicalDeviceExternalSemaphoreProperties =
       (PFN_vkGetPhysicalDeviceExternalSemaphoreProperties)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceExternalSemaphoreProperties");
  vkGetPhysicalDeviceFeatures2 =
       (PFN_vkGetPhysicalDeviceFeatures2)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceFeatures2");
  vkGetPhysicalDeviceFormatProperties2 =
       (PFN_vkGetPhysicalDeviceFormatProperties2)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceFormatProperties2");
  vkGetPhysicalDeviceImageFormatProperties2 =
       (PFN_vkGetPhysicalDeviceImageFormatProperties2)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceImageFormatProperties2");
  vkGetPhysicalDeviceMemoryProperties2 =
       (PFN_vkGetPhysicalDeviceMemoryProperties2)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceMemoryProperties2");
  vkGetPhysicalDeviceProperties2 =
       (PFN_vkGetPhysicalDeviceProperties2)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceProperties2");
  vkGetPhysicalDeviceQueueFamilyProperties2 =
       (PFN_vkGetPhysicalDeviceQueueFamilyProperties2)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceQueueFamilyProperties2");
  vkGetPhysicalDeviceSparseImageFormatProperties2 =
       (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceSparseImageFormatProperties2");
  vkGetPhysicalDeviceToolProperties =
       (PFN_vkGetPhysicalDeviceToolProperties)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceToolProperties");
  vkAcquireDrmDisplayEXT =
       (PFN_vkAcquireDrmDisplayEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkAcquireDrmDisplayEXT");
  vkGetDrmDisplayEXT =
       (PFN_vkGetDrmDisplayEXT)(*vkGetInstanceProcAddr)((VkInstance)context,"vkGetDrmDisplayEXT");
  vkGetPhysicalDeviceCalibrateableTimeDomainsEXT =
       (PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsEXT)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceCalibrateableTimeDomainsEXT");
  vkCreateDebugReportCallbackEXT =
       (PFN_vkCreateDebugReportCallbackEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkCreateDebugReportCallbackEXT");
  vkDebugReportMessageEXT =
       (PFN_vkDebugReportMessageEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkDebugReportMessageEXT");
  vkDestroyDebugReportCallbackEXT =
       (PFN_vkDestroyDebugReportCallbackEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkDestroyDebugReportCallbackEXT");
  vkCmdBeginDebugUtilsLabelEXT =
       (PFN_vkCmdBeginDebugUtilsLabelEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkCmdBeginDebugUtilsLabelEXT");
  vkCmdEndDebugUtilsLabelEXT =
       (PFN_vkCmdEndDebugUtilsLabelEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkCmdEndDebugUtilsLabelEXT");
  vkCmdInsertDebugUtilsLabelEXT =
       (PFN_vkCmdInsertDebugUtilsLabelEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkCmdInsertDebugUtilsLabelEXT");
  vkCreateDebugUtilsMessengerEXT =
       (PFN_vkCreateDebugUtilsMessengerEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkCreateDebugUtilsMessengerEXT");
  vkDestroyDebugUtilsMessengerEXT =
       (PFN_vkDestroyDebugUtilsMessengerEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkDestroyDebugUtilsMessengerEXT");
  vkQueueBeginDebugUtilsLabelEXT =
       (PFN_vkQueueBeginDebugUtilsLabelEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkQueueBeginDebugUtilsLabelEXT");
  vkQueueEndDebugUtilsLabelEXT =
       (PFN_vkQueueEndDebugUtilsLabelEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkQueueEndDebugUtilsLabelEXT");
  vkQueueInsertDebugUtilsLabelEXT =
       (PFN_vkQueueInsertDebugUtilsLabelEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkQueueInsertDebugUtilsLabelEXT");
  vkSetDebugUtilsObjectNameEXT =
       (PFN_vkSetDebugUtilsObjectNameEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkSetDebugUtilsObjectNameEXT");
  vkSetDebugUtilsObjectTagEXT =
       (PFN_vkSetDebugUtilsObjectTagEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkSetDebugUtilsObjectTagEXT");
  vkSubmitDebugUtilsMessageEXT =
       (PFN_vkSubmitDebugUtilsMessageEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkSubmitDebugUtilsMessageEXT");
  vkReleaseDisplayEXT =
       (PFN_vkReleaseDisplayEXT)(*vkGetInstanceProcAddr)((VkInstance)context,"vkReleaseDisplayEXT");
  vkGetPhysicalDeviceSurfaceCapabilities2EXT =
       (PFN_vkGetPhysicalDeviceSurfaceCapabilities2EXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceSurfaceCapabilities2EXT");
  vkCreateHeadlessSurfaceEXT =
       (PFN_vkCreateHeadlessSurfaceEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkCreateHeadlessSurfaceEXT");
  vkGetPhysicalDeviceMultisamplePropertiesEXT =
       (PFN_vkGetPhysicalDeviceMultisamplePropertiesEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceMultisamplePropertiesEXT");
  vkGetPhysicalDeviceToolPropertiesEXT =
       (PFN_vkGetPhysicalDeviceToolPropertiesEXT)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceToolPropertiesEXT");
  vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR =
       (PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR");
  vkEnumeratePhysicalDeviceGroupsKHR =
       (PFN_vkEnumeratePhysicalDeviceGroupsKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkEnumeratePhysicalDeviceGroupsKHR");
  vkCreateDisplayModeKHR =
       (PFN_vkCreateDisplayModeKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkCreateDisplayModeKHR");
  vkCreateDisplayPlaneSurfaceKHR =
       (PFN_vkCreateDisplayPlaneSurfaceKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkCreateDisplayPlaneSurfaceKHR");
  vkGetDisplayModePropertiesKHR =
       (PFN_vkGetDisplayModePropertiesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetDisplayModePropertiesKHR");
  vkGetDisplayPlaneCapabilitiesKHR =
       (PFN_vkGetDisplayPlaneCapabilitiesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetDisplayPlaneCapabilitiesKHR");
  vkGetDisplayPlaneSupportedDisplaysKHR =
       (PFN_vkGetDisplayPlaneSupportedDisplaysKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetDisplayPlaneSupportedDisplaysKHR");
  vkGetPhysicalDeviceDisplayPlanePropertiesKHR =
       (PFN_vkGetPhysicalDeviceDisplayPlanePropertiesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceDisplayPlanePropertiesKHR");
  vkGetPhysicalDeviceDisplayPropertiesKHR =
       (PFN_vkGetPhysicalDeviceDisplayPropertiesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceDisplayPropertiesKHR");
  vkGetPhysicalDeviceExternalFencePropertiesKHR =
       (PFN_vkGetPhysicalDeviceExternalFencePropertiesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceExternalFencePropertiesKHR")
  ;
  vkGetPhysicalDeviceExternalBufferPropertiesKHR =
       (PFN_vkGetPhysicalDeviceExternalBufferPropertiesKHR)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceExternalBufferPropertiesKHR");
  vkGetPhysicalDeviceExternalSemaphorePropertiesKHR =
       (PFN_vkGetPhysicalDeviceExternalSemaphorePropertiesKHR)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceExternalSemaphorePropertiesKHR");
  vkGetPhysicalDeviceFragmentShadingRatesKHR =
       (PFN_vkGetPhysicalDeviceFragmentShadingRatesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceFragmentShadingRatesKHR");
  vkGetDisplayModeProperties2KHR =
       (PFN_vkGetDisplayModeProperties2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetDisplayModeProperties2KHR");
  vkGetDisplayPlaneCapabilities2KHR =
       (PFN_vkGetDisplayPlaneCapabilities2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetDisplayPlaneCapabilities2KHR");
  vkGetPhysicalDeviceDisplayPlaneProperties2KHR =
       (PFN_vkGetPhysicalDeviceDisplayPlaneProperties2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceDisplayPlaneProperties2KHR")
  ;
  vkGetPhysicalDeviceDisplayProperties2KHR =
       (PFN_vkGetPhysicalDeviceDisplayProperties2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceDisplayProperties2KHR");
  vkGetPhysicalDeviceFeatures2KHR =
       (PFN_vkGetPhysicalDeviceFeatures2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceFeatures2KHR");
  vkGetPhysicalDeviceFormatProperties2KHR =
       (PFN_vkGetPhysicalDeviceFormatProperties2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceFormatProperties2KHR");
  vkGetPhysicalDeviceImageFormatProperties2KHR =
       (PFN_vkGetPhysicalDeviceImageFormatProperties2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceImageFormatProperties2KHR");
  vkGetPhysicalDeviceMemoryProperties2KHR =
       (PFN_vkGetPhysicalDeviceMemoryProperties2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceMemoryProperties2KHR");
  vkGetPhysicalDeviceProperties2KHR =
       (PFN_vkGetPhysicalDeviceProperties2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceProperties2KHR");
  vkGetPhysicalDeviceQueueFamilyProperties2KHR =
       (PFN_vkGetPhysicalDeviceQueueFamilyProperties2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceQueueFamilyProperties2KHR");
  vkGetPhysicalDeviceSparseImageFormatProperties2KHR =
       (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2KHR)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceSparseImageFormatProperties2KHR");
  vkGetPhysicalDeviceSurfaceCapabilities2KHR =
       (PFN_vkGetPhysicalDeviceSurfaceCapabilities2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceSurfaceCapabilities2KHR");
  vkGetPhysicalDeviceSurfaceFormats2KHR =
       (PFN_vkGetPhysicalDeviceSurfaceFormats2KHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceSurfaceFormats2KHR");
  vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR =
       (PFN_vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,
                  "vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR");
  vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR =
       (PFN_vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR");
  vkDestroySurfaceKHR =
       (PFN_vkDestroySurfaceKHR)(*vkGetInstanceProcAddr)((VkInstance)context,"vkDestroySurfaceKHR");
  vkGetPhysicalDeviceSurfaceCapabilitiesKHR =
       (PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceSurfaceCapabilitiesKHR");
  vkGetPhysicalDeviceSurfaceFormatsKHR =
       (PFN_vkGetPhysicalDeviceSurfaceFormatsKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceSurfaceFormatsKHR");
  vkGetPhysicalDeviceSurfacePresentModesKHR =
       (PFN_vkGetPhysicalDeviceSurfacePresentModesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceSurfacePresentModesKHR");
  vkGetPhysicalDeviceSurfaceSupportKHR =
       (PFN_vkGetPhysicalDeviceSurfaceSupportKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceSurfaceSupportKHR");
  vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR =
       (PFN_vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR");
  vkGetPhysicalDeviceVideoCapabilitiesKHR =
       (PFN_vkGetPhysicalDeviceVideoCapabilitiesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceVideoCapabilitiesKHR");
  vkGetPhysicalDeviceVideoFormatPropertiesKHR =
       (PFN_vkGetPhysicalDeviceVideoFormatPropertiesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceVideoFormatPropertiesKHR");
  vkGetPhysicalDeviceCooperativeMatrixPropertiesNV =
       (PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesNV)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceCooperativeMatrixPropertiesNV");
  vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV =
       (PFN_vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,
                  "vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV");
  vkGetPhysicalDeviceExternalImageFormatPropertiesNV =
       (PFN_vkGetPhysicalDeviceExternalImageFormatPropertiesNV)
       (*vkGetInstanceProcAddr)
                 ((VkInstance)context,"vkGetPhysicalDeviceExternalImageFormatPropertiesNV");
  vkGetPhysicalDeviceOpticalFlowImageFormatsNV =
       (PFN_vkGetPhysicalDeviceOpticalFlowImageFormatsNV)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDeviceOpticalFlowImageFormatsNV");
  vkGetPhysicalDevicePresentRectanglesKHR =
       (PFN_vkGetPhysicalDevicePresentRectanglesKHR)
       (*vkGetInstanceProcAddr)((VkInstance)context,"vkGetPhysicalDevicePresentRectanglesKHR");
  return;
}

Assistant:

static void volkGenLoadInstance(void* context, PFN_vkVoidFunction (*load)(void*, const char*))
{
	/* VOLK_GENERATE_LOAD_INSTANCE */
#if defined(VK_VERSION_1_0)
	vkCreateDevice = (PFN_vkCreateDevice)load(context, "vkCreateDevice");
	vkDestroyInstance = (PFN_vkDestroyInstance)load(context, "vkDestroyInstance");
	vkEnumerateDeviceExtensionProperties = (PFN_vkEnumerateDeviceExtensionProperties)load(context, "vkEnumerateDeviceExtensionProperties");
	vkEnumerateDeviceLayerProperties = (PFN_vkEnumerateDeviceLayerProperties)load(context, "vkEnumerateDeviceLayerProperties");
	vkEnumeratePhysicalDevices = (PFN_vkEnumeratePhysicalDevices)load(context, "vkEnumeratePhysicalDevices");
	vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)load(context, "vkGetDeviceProcAddr");
	vkGetPhysicalDeviceFeatures = (PFN_vkGetPhysicalDeviceFeatures)load(context, "vkGetPhysicalDeviceFeatures");
	vkGetPhysicalDeviceFormatProperties = (PFN_vkGetPhysicalDeviceFormatProperties)load(context, "vkGetPhysicalDeviceFormatProperties");
	vkGetPhysicalDeviceImageFormatProperties = (PFN_vkGetPhysicalDeviceImageFormatProperties)load(context, "vkGetPhysicalDeviceImageFormatProperties");
	vkGetPhysicalDeviceMemoryProperties = (PFN_vkGetPhysicalDeviceMemoryProperties)load(context, "vkGetPhysicalDeviceMemoryProperties");
	vkGetPhysicalDeviceProperties = (PFN_vkGetPhysicalDeviceProperties)load(context, "vkGetPhysicalDeviceProperties");
	vkGetPhysicalDeviceQueueFamilyProperties = (PFN_vkGetPhysicalDeviceQueueFamilyProperties)load(context, "vkGetPhysicalDeviceQueueFamilyProperties");
	vkGetPhysicalDeviceSparseImageFormatProperties = (PFN_vkGetPhysicalDeviceSparseImageFormatProperties)load(context, "vkGetPhysicalDeviceSparseImageFormatProperties");
#endif /* defined(VK_VERSION_1_0) */
#if defined(VK_VERSION_1_1)
	vkEnumeratePhysicalDeviceGroups = (PFN_vkEnumeratePhysicalDeviceGroups)load(context, "vkEnumeratePhysicalDeviceGroups");
	vkGetPhysicalDeviceExternalBufferProperties = (PFN_vkGetPhysicalDeviceExternalBufferProperties)load(context, "vkGetPhysicalDeviceExternalBufferProperties");
	vkGetPhysicalDeviceExternalFenceProperties = (PFN_vkGetPhysicalDeviceExternalFenceProperties)load(context, "vkGetPhysicalDeviceExternalFenceProperties");
	vkGetPhysicalDeviceExternalSemaphoreProperties = (PFN_vkGetPhysicalDeviceExternalSemaphoreProperties)load(context, "vkGetPhysicalDeviceExternalSemaphoreProperties");
	vkGetPhysicalDeviceFeatures2 = (PFN_vkGetPhysicalDeviceFeatures2)load(context, "vkGetPhysicalDeviceFeatures2");
	vkGetPhysicalDeviceFormatProperties2 = (PFN_vkGetPhysicalDeviceFormatProperties2)load(context, "vkGetPhysicalDeviceFormatProperties2");
	vkGetPhysicalDeviceImageFormatProperties2 = (PFN_vkGetPhysicalDeviceImageFormatProperties2)load(context, "vkGetPhysicalDeviceImageFormatProperties2");
	vkGetPhysicalDeviceMemoryProperties2 = (PFN_vkGetPhysicalDeviceMemoryProperties2)load(context, "vkGetPhysicalDeviceMemoryProperties2");
	vkGetPhysicalDeviceProperties2 = (PFN_vkGetPhysicalDeviceProperties2)load(context, "vkGetPhysicalDeviceProperties2");
	vkGetPhysicalDeviceQueueFamilyProperties2 = (PFN_vkGetPhysicalDeviceQueueFamilyProperties2)load(context, "vkGetPhysicalDeviceQueueFamilyProperties2");
	vkGetPhysicalDeviceSparseImageFormatProperties2 = (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2)load(context, "vkGetPhysicalDeviceSparseImageFormatProperties2");
#endif /* defined(VK_VERSION_1_1) */
#if defined(VK_VERSION_1_3)
	vkGetPhysicalDeviceToolProperties = (PFN_vkGetPhysicalDeviceToolProperties)load(context, "vkGetPhysicalDeviceToolProperties");
#endif /* defined(VK_VERSION_1_3) */
#if defined(VK_EXT_acquire_drm_display)
	vkAcquireDrmDisplayEXT = (PFN_vkAcquireDrmDisplayEXT)load(context, "vkAcquireDrmDisplayEXT");
	vkGetDrmDisplayEXT = (PFN_vkGetDrmDisplayEXT)load(context, "vkGetDrmDisplayEXT");
#endif /* defined(VK_EXT_acquire_drm_display) */
#if defined(VK_EXT_acquire_xlib_display)
	vkAcquireXlibDisplayEXT = (PFN_vkAcquireXlibDisplayEXT)load(context, "vkAcquireXlibDisplayEXT");
	vkGetRandROutputDisplayEXT = (PFN_vkGetRandROutputDisplayEXT)load(context, "vkGetRandROutputDisplayEXT");
#endif /* defined(VK_EXT_acquire_xlib_display) */
#if defined(VK_EXT_calibrated_timestamps)
	vkGetPhysicalDeviceCalibrateableTimeDomainsEXT = (PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsEXT)load(context, "vkGetPhysicalDeviceCalibrateableTimeDomainsEXT");
#endif /* defined(VK_EXT_calibrated_timestamps) */
#if defined(VK_EXT_debug_report)
	vkCreateDebugReportCallbackEXT = (PFN_vkCreateDebugReportCallbackEXT)load(context, "vkCreateDebugReportCallbackEXT");
	vkDebugReportMessageEXT = (PFN_vkDebugReportMessageEXT)load(context, "vkDebugReportMessageEXT");
	vkDestroyDebugReportCallbackEXT = (PFN_vkDestroyDebugReportCallbackEXT)load(context, "vkDestroyDebugReportCallbackEXT");
#endif /* defined(VK_EXT_debug_report) */
#if defined(VK_EXT_debug_utils)
	vkCmdBeginDebugUtilsLabelEXT = (PFN_vkCmdBeginDebugUtilsLabelEXT)load(context, "vkCmdBeginDebugUtilsLabelEXT");
	vkCmdEndDebugUtilsLabelEXT = (PFN_vkCmdEndDebugUtilsLabelEXT)load(context, "vkCmdEndDebugUtilsLabelEXT");
	vkCmdInsertDebugUtilsLabelEXT = (PFN_vkCmdInsertDebugUtilsLabelEXT)load(context, "vkCmdInsertDebugUtilsLabelEXT");
	vkCreateDebugUtilsMessengerEXT = (PFN_vkCreateDebugUtilsMessengerEXT)load(context, "vkCreateDebugUtilsMessengerEXT");
	vkDestroyDebugUtilsMessengerEXT = (PFN_vkDestroyDebugUtilsMessengerEXT)load(context, "vkDestroyDebugUtilsMessengerEXT");
	vkQueueBeginDebugUtilsLabelEXT = (PFN_vkQueueBeginDebugUtilsLabelEXT)load(context, "vkQueueBeginDebugUtilsLabelEXT");
	vkQueueEndDebugUtilsLabelEXT = (PFN_vkQueueEndDebugUtilsLabelEXT)load(context, "vkQueueEndDebugUtilsLabelEXT");
	vkQueueInsertDebugUtilsLabelEXT = (PFN_vkQueueInsertDebugUtilsLabelEXT)load(context, "vkQueueInsertDebugUtilsLabelEXT");
	vkSetDebugUtilsObjectNameEXT = (PFN_vkSetDebugUtilsObjectNameEXT)load(context, "vkSetDebugUtilsObjectNameEXT");
	vkSetDebugUtilsObjectTagEXT = (PFN_vkSetDebugUtilsObjectTagEXT)load(context, "vkSetDebugUtilsObjectTagEXT");
	vkSubmitDebugUtilsMessageEXT = (PFN_vkSubmitDebugUtilsMessageEXT)load(context, "vkSubmitDebugUtilsMessageEXT");
#endif /* defined(VK_EXT_debug_utils) */
#if defined(VK_EXT_direct_mode_display)
	vkReleaseDisplayEXT = (PFN_vkReleaseDisplayEXT)load(context, "vkReleaseDisplayEXT");
#endif /* defined(VK_EXT_direct_mode_display) */
#if defined(VK_EXT_directfb_surface)
	vkCreateDirectFBSurfaceEXT = (PFN_vkCreateDirectFBSurfaceEXT)load(context, "vkCreateDirectFBSurfaceEXT");
	vkGetPhysicalDeviceDirectFBPresentationSupportEXT = (PFN_vkGetPhysicalDeviceDirectFBPresentationSupportEXT)load(context, "vkGetPhysicalDeviceDirectFBPresentationSupportEXT");
#endif /* defined(VK_EXT_directfb_surface) */
#if defined(VK_EXT_display_surface_counter)
	vkGetPhysicalDeviceSurfaceCapabilities2EXT = (PFN_vkGetPhysicalDeviceSurfaceCapabilities2EXT)load(context, "vkGetPhysicalDeviceSurfaceCapabilities2EXT");
#endif /* defined(VK_EXT_display_surface_counter) */
#if defined(VK_EXT_full_screen_exclusive)
	vkGetPhysicalDeviceSurfacePresentModes2EXT = (PFN_vkGetPhysicalDeviceSurfacePresentModes2EXT)load(context, "vkGetPhysicalDeviceSurfacePresentModes2EXT");
#endif /* defined(VK_EXT_full_screen_exclusive) */
#if defined(VK_EXT_headless_surface)
	vkCreateHeadlessSurfaceEXT = (PFN_vkCreateHeadlessSurfaceEXT)load(context, "vkCreateHeadlessSurfaceEXT");
#endif /* defined(VK_EXT_headless_surface) */
#if defined(VK_EXT_metal_surface)
	vkCreateMetalSurfaceEXT = (PFN_vkCreateMetalSurfaceEXT)load(context, "vkCreateMetalSurfaceEXT");
#endif /* defined(VK_EXT_metal_surface) */
#if defined(VK_EXT_sample_locations)
	vkGetPhysicalDeviceMultisamplePropertiesEXT = (PFN_vkGetPhysicalDeviceMultisamplePropertiesEXT)load(context, "vkGetPhysicalDeviceMultisamplePropertiesEXT");
#endif /* defined(VK_EXT_sample_locations) */
#if defined(VK_EXT_tooling_info)
	vkGetPhysicalDeviceToolPropertiesEXT = (PFN_vkGetPhysicalDeviceToolPropertiesEXT)load(context, "vkGetPhysicalDeviceToolPropertiesEXT");
#endif /* defined(VK_EXT_tooling_info) */
#if defined(VK_FUCHSIA_imagepipe_surface)
	vkCreateImagePipeSurfaceFUCHSIA = (PFN_vkCreateImagePipeSurfaceFUCHSIA)load(context, "vkCreateImagePipeSurfaceFUCHSIA");
#endif /* defined(VK_FUCHSIA_imagepipe_surface) */
#if defined(VK_GGP_stream_descriptor_surface)
	vkCreateStreamDescriptorSurfaceGGP = (PFN_vkCreateStreamDescriptorSurfaceGGP)load(context, "vkCreateStreamDescriptorSurfaceGGP");
#endif /* defined(VK_GGP_stream_descriptor_surface) */
#if defined(VK_KHR_android_surface)
	vkCreateAndroidSurfaceKHR = (PFN_vkCreateAndroidSurfaceKHR)load(context, "vkCreateAndroidSurfaceKHR");
#endif /* defined(VK_KHR_android_surface) */
#if defined(VK_KHR_cooperative_matrix)
	vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR = (PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR)load(context, "vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR");
#endif /* defined(VK_KHR_cooperative_matrix) */
#if defined(VK_KHR_device_group_creation)
	vkEnumeratePhysicalDeviceGroupsKHR = (PFN_vkEnumeratePhysicalDeviceGroupsKHR)load(context, "vkEnumeratePhysicalDeviceGroupsKHR");
#endif /* defined(VK_KHR_device_group_creation) */
#if defined(VK_KHR_display)
	vkCreateDisplayModeKHR = (PFN_vkCreateDisplayModeKHR)load(context, "vkCreateDisplayModeKHR");
	vkCreateDisplayPlaneSurfaceKHR = (PFN_vkCreateDisplayPlaneSurfaceKHR)load(context, "vkCreateDisplayPlaneSurfaceKHR");
	vkGetDisplayModePropertiesKHR = (PFN_vkGetDisplayModePropertiesKHR)load(context, "vkGetDisplayModePropertiesKHR");
	vkGetDisplayPlaneCapabilitiesKHR = (PFN_vkGetDisplayPlaneCapabilitiesKHR)load(context, "vkGetDisplayPlaneCapabilitiesKHR");
	vkGetDisplayPlaneSupportedDisplaysKHR = (PFN_vkGetDisplayPlaneSupportedDisplaysKHR)load(context, "vkGetDisplayPlaneSupportedDisplaysKHR");
	vkGetPhysicalDeviceDisplayPlanePropertiesKHR = (PFN_vkGetPhysicalDeviceDisplayPlanePropertiesKHR)load(context, "vkGetPhysicalDeviceDisplayPlanePropertiesKHR");
	vkGetPhysicalDeviceDisplayPropertiesKHR = (PFN_vkGetPhysicalDeviceDisplayPropertiesKHR)load(context, "vkGetPhysicalDeviceDisplayPropertiesKHR");
#endif /* defined(VK_KHR_display) */
#if defined(VK_KHR_external_fence_capabilities)
	vkGetPhysicalDeviceExternalFencePropertiesKHR = (PFN_vkGetPhysicalDeviceExternalFencePropertiesKHR)load(context, "vkGetPhysicalDeviceExternalFencePropertiesKHR");
#endif /* defined(VK_KHR_external_fence_capabilities) */
#if defined(VK_KHR_external_memory_capabilities)
	vkGetPhysicalDeviceExternalBufferPropertiesKHR = (PFN_vkGetPhysicalDeviceExternalBufferPropertiesKHR)load(context, "vkGetPhysicalDeviceExternalBufferPropertiesKHR");
#endif /* defined(VK_KHR_external_memory_capabilities) */
#if defined(VK_KHR_external_semaphore_capabilities)
	vkGetPhysicalDeviceExternalSemaphorePropertiesKHR = (PFN_vkGetPhysicalDeviceExternalSemaphorePropertiesKHR)load(context, "vkGetPhysicalDeviceExternalSemaphorePropertiesKHR");
#endif /* defined(VK_KHR_external_semaphore_capabilities) */
#if defined(VK_KHR_fragment_shading_rate)
	vkGetPhysicalDeviceFragmentShadingRatesKHR = (PFN_vkGetPhysicalDeviceFragmentShadingRatesKHR)load(context, "vkGetPhysicalDeviceFragmentShadingRatesKHR");
#endif /* defined(VK_KHR_fragment_shading_rate) */
#if defined(VK_KHR_get_display_properties2)
	vkGetDisplayModeProperties2KHR = (PFN_vkGetDisplayModeProperties2KHR)load(context, "vkGetDisplayModeProperties2KHR");
	vkGetDisplayPlaneCapabilities2KHR = (PFN_vkGetDisplayPlaneCapabilities2KHR)load(context, "vkGetDisplayPlaneCapabilities2KHR");
	vkGetPhysicalDeviceDisplayPlaneProperties2KHR = (PFN_vkGetPhysicalDeviceDisplayPlaneProperties2KHR)load(context, "vkGetPhysicalDeviceDisplayPlaneProperties2KHR");
	vkGetPhysicalDeviceDisplayProperties2KHR = (PFN_vkGetPhysicalDeviceDisplayProperties2KHR)load(context, "vkGetPhysicalDeviceDisplayProperties2KHR");
#endif /* defined(VK_KHR_get_display_properties2) */
#if defined(VK_KHR_get_physical_device_properties2)
	vkGetPhysicalDeviceFeatures2KHR = (PFN_vkGetPhysicalDeviceFeatures2KHR)load(context, "vkGetPhysicalDeviceFeatures2KHR");
	vkGetPhysicalDeviceFormatProperties2KHR = (PFN_vkGetPhysicalDeviceFormatProperties2KHR)load(context, "vkGetPhysicalDeviceFormatProperties2KHR");
	vkGetPhysicalDeviceImageFormatProperties2KHR = (PFN_vkGetPhysicalDeviceImageFormatProperties2KHR)load(context, "vkGetPhysicalDeviceImageFormatProperties2KHR");
	vkGetPhysicalDeviceMemoryProperties2KHR = (PFN_vkGetPhysicalDeviceMemoryProperties2KHR)load(context, "vkGetPhysicalDeviceMemoryProperties2KHR");
	vkGetPhysicalDeviceProperties2KHR = (PFN_vkGetPhysicalDeviceProperties2KHR)load(context, "vkGetPhysicalDeviceProperties2KHR");
	vkGetPhysicalDeviceQueueFamilyProperties2KHR = (PFN_vkGetPhysicalDeviceQueueFamilyProperties2KHR)load(context, "vkGetPhysicalDeviceQueueFamilyProperties2KHR");
	vkGetPhysicalDeviceSparseImageFormatProperties2KHR = (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2KHR)load(context, "vkGetPhysicalDeviceSparseImageFormatProperties2KHR");
#endif /* defined(VK_KHR_get_physical_device_properties2) */
#if defined(VK_KHR_get_surface_capabilities2)
	vkGetPhysicalDeviceSurfaceCapabilities2KHR = (PFN_vkGetPhysicalDeviceSurfaceCapabilities2KHR)load(context, "vkGetPhysicalDeviceSurfaceCapabilities2KHR");
	vkGetPhysicalDeviceSurfaceFormats2KHR = (PFN_vkGetPhysicalDeviceSurfaceFormats2KHR)load(context, "vkGetPhysicalDeviceSurfaceFormats2KHR");
#endif /* defined(VK_KHR_get_surface_capabilities2) */
#if defined(VK_KHR_performance_query)
	vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR = (PFN_vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR)load(context, "vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR");
	vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR = (PFN_vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR)load(context, "vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR");
#endif /* defined(VK_KHR_performance_query) */
#if defined(VK_KHR_surface)
	vkDestroySurfaceKHR = (PFN_vkDestroySurfaceKHR)load(context, "vkDestroySurfaceKHR");
	vkGetPhysicalDeviceSurfaceCapabilitiesKHR = (PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)load(context, "vkGetPhysicalDeviceSurfaceCapabilitiesKHR");
	vkGetPhysicalDeviceSurfaceFormatsKHR = (PFN_vkGetPhysicalDeviceSurfaceFormatsKHR)load(context, "vkGetPhysicalDeviceSurfaceFormatsKHR");
	vkGetPhysicalDeviceSurfacePresentModesKHR = (PFN_vkGetPhysicalDeviceSurfacePresentModesKHR)load(context, "vkGetPhysicalDeviceSurfacePresentModesKHR");
	vkGetPhysicalDeviceSurfaceSupportKHR = (PFN_vkGetPhysicalDeviceSurfaceSupportKHR)load(context, "vkGetPhysicalDeviceSurfaceSupportKHR");
#endif /* defined(VK_KHR_surface) */
#if defined(VK_KHR_video_encode_queue)
	vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR = (PFN_vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR)load(context, "vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR");
#endif /* defined(VK_KHR_video_encode_queue) */
#if defined(VK_KHR_video_queue)
	vkGetPhysicalDeviceVideoCapabilitiesKHR = (PFN_vkGetPhysicalDeviceVideoCapabilitiesKHR)load(context, "vkGetPhysicalDeviceVideoCapabilitiesKHR");
	vkGetPhysicalDeviceVideoFormatPropertiesKHR = (PFN_vkGetPhysicalDeviceVideoFormatPropertiesKHR)load(context, "vkGetPhysicalDeviceVideoFormatPropertiesKHR");
#endif /* defined(VK_KHR_video_queue) */
#if defined(VK_KHR_wayland_surface)
	vkCreateWaylandSurfaceKHR = (PFN_vkCreateWaylandSurfaceKHR)load(context, "vkCreateWaylandSurfaceKHR");
	vkGetPhysicalDeviceWaylandPresentationSupportKHR = (PFN_vkGetPhysicalDeviceWaylandPresentationSupportKHR)load(context, "vkGetPhysicalDeviceWaylandPresentationSupportKHR");
#endif /* defined(VK_KHR_wayland_surface) */
#if defined(VK_KHR_win32_surface)
	vkCreateWin32SurfaceKHR = (PFN_vkCreateWin32SurfaceKHR)load(context, "vkCreateWin32SurfaceKHR");
	vkGetPhysicalDeviceWin32PresentationSupportKHR = (PFN_vkGetPhysicalDeviceWin32PresentationSupportKHR)load(context, "vkGetPhysicalDeviceWin32PresentationSupportKHR");
#endif /* defined(VK_KHR_win32_surface) */
#if defined(VK_KHR_xcb_surface)
	vkCreateXcbSurfaceKHR = (PFN_vkCreateXcbSurfaceKHR)load(context, "vkCreateXcbSurfaceKHR");
	vkGetPhysicalDeviceXcbPresentationSupportKHR = (PFN_vkGetPhysicalDeviceXcbPresentationSupportKHR)load(context, "vkGetPhysicalDeviceXcbPresentationSupportKHR");
#endif /* defined(VK_KHR_xcb_surface) */
#if defined(VK_KHR_xlib_surface)
	vkCreateXlibSurfaceKHR = (PFN_vkCreateXlibSurfaceKHR)load(context, "vkCreateXlibSurfaceKHR");
	vkGetPhysicalDeviceXlibPresentationSupportKHR = (PFN_vkGetPhysicalDeviceXlibPresentationSupportKHR)load(context, "vkGetPhysicalDeviceXlibPresentationSupportKHR");
#endif /* defined(VK_KHR_xlib_surface) */
#if defined(VK_MVK_ios_surface)
	vkCreateIOSSurfaceMVK = (PFN_vkCreateIOSSurfaceMVK)load(context, "vkCreateIOSSurfaceMVK");
#endif /* defined(VK_MVK_ios_surface) */
#if defined(VK_MVK_macos_surface)
	vkCreateMacOSSurfaceMVK = (PFN_vkCreateMacOSSurfaceMVK)load(context, "vkCreateMacOSSurfaceMVK");
#endif /* defined(VK_MVK_macos_surface) */
#if defined(VK_NN_vi_surface)
	vkCreateViSurfaceNN = (PFN_vkCreateViSurfaceNN)load(context, "vkCreateViSurfaceNN");
#endif /* defined(VK_NN_vi_surface) */
#if defined(VK_NV_acquire_winrt_display)
	vkAcquireWinrtDisplayNV = (PFN_vkAcquireWinrtDisplayNV)load(context, "vkAcquireWinrtDisplayNV");
	vkGetWinrtDisplayNV = (PFN_vkGetWinrtDisplayNV)load(context, "vkGetWinrtDisplayNV");
#endif /* defined(VK_NV_acquire_winrt_display) */
#if defined(VK_NV_cooperative_matrix)
	vkGetPhysicalDeviceCooperativeMatrixPropertiesNV = (PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesNV)load(context, "vkGetPhysicalDeviceCooperativeMatrixPropertiesNV");
#endif /* defined(VK_NV_cooperative_matrix) */
#if defined(VK_NV_coverage_reduction_mode)
	vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV = (PFN_vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV)load(context, "vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV");
#endif /* defined(VK_NV_coverage_reduction_mode) */
#if defined(VK_NV_external_memory_capabilities)
	vkGetPhysicalDeviceExternalImageFormatPropertiesNV = (PFN_vkGetPhysicalDeviceExternalImageFormatPropertiesNV)load(context, "vkGetPhysicalDeviceExternalImageFormatPropertiesNV");
#endif /* defined(VK_NV_external_memory_capabilities) */
#if defined(VK_NV_optical_flow)
	vkGetPhysicalDeviceOpticalFlowImageFormatsNV = (PFN_vkGetPhysicalDeviceOpticalFlowImageFormatsNV)load(context, "vkGetPhysicalDeviceOpticalFlowImageFormatsNV");
#endif /* defined(VK_NV_optical_flow) */
#if defined(VK_QNX_screen_surface)
	vkCreateScreenSurfaceQNX = (PFN_vkCreateScreenSurfaceQNX)load(context, "vkCreateScreenSurfaceQNX");
	vkGetPhysicalDeviceScreenPresentationSupportQNX = (PFN_vkGetPhysicalDeviceScreenPresentationSupportQNX)load(context, "vkGetPhysicalDeviceScreenPresentationSupportQNX");
#endif /* defined(VK_QNX_screen_surface) */
#if (defined(VK_KHR_device_group) && defined(VK_KHR_surface)) || (defined(VK_KHR_swapchain) && defined(VK_VERSION_1_1))
	vkGetPhysicalDevicePresentRectanglesKHR = (PFN_vkGetPhysicalDevicePresentRectanglesKHR)load(context, "vkGetPhysicalDevicePresentRectanglesKHR");
#endif /* (defined(VK_KHR_device_group) && defined(VK_KHR_surface)) || (defined(VK_KHR_swapchain) && defined(VK_VERSION_1_1)) */
	/* VOLK_GENERATE_LOAD_INSTANCE */
}